

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decFactor.c
# Opt level: O0

Mvc_Cover_t * Dec_ConvertSopToMvc(char *pSop)

{
  Mvc_Manager_t *pMem_00;
  int iVar1;
  undefined8 *puVar2;
  Mvc_Cover_t *pCover;
  Mvc_Cube_t *pMVar3;
  int iVar4;
  bool bVar5;
  uint local_54;
  int _i_;
  Mvc_List_t *pList;
  int local_40;
  int v;
  int Value;
  int nVars;
  char *pCube;
  Mvc_Cube_t *pMvcCube;
  Mvc_Cover_t *pMvc;
  Mvc_Manager_t *pMem;
  Dec_Man_t *pManDec;
  char *pSop_local;
  
  puVar2 = (undefined8 *)Abc_FrameReadManDec();
  pMem_00 = (Mvc_Manager_t *)*puVar2;
  iVar1 = Abc_SopGetVarNum(pSop);
  if (iVar1 < 1) {
    __assert_fail("nVars > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/dec/decFactor.c"
                  ,0x151,"Mvc_Cover_t *Dec_ConvertSopToMvc(char *)");
  }
  pCover = Mvc_CoverAlloc(pMem_00,iVar1 << 1);
  for (_Value = pSop; *_Value != '\0'; _Value = _Value + (iVar1 + 3)) {
    pMVar3 = Mvc_CubeAlloc(pCover);
    if ((pCover->lCubes).pHead == (Mvc_Cube_t *)0x0) {
      (pCover->lCubes).pHead = pMVar3;
    }
    else {
      ((pCover->lCubes).pTail)->pNext = pMVar3;
    }
    (pCover->lCubes).pTail = pMVar3;
    pMVar3->pNext = (Mvc_Cube_t *)0x0;
    (pCover->lCubes).nItems = (pCover->lCubes).nItems + 1;
    if ((*(uint *)&pMVar3->field_0x8 & 0xffffff) == 0) {
      pMVar3->pData[0] =
           0xffffffff >> ((byte)((uint)*(undefined4 *)&pMVar3->field_0x8 >> 0x18) & 0x1f);
    }
    else if ((*(uint *)&pMVar3->field_0x8 & 0xffffff) == 1) {
      pMVar3->pData[0] = 0xffffffff;
      *(uint *)&pMVar3->field_0x14 =
           0xffffffff >> ((byte)((uint)*(undefined4 *)&pMVar3->field_0x8 >> 0x18) & 0x1f);
    }
    else {
      pMVar3->pData[*(uint *)&pMVar3->field_0x8 & 0xffffff] =
           0xffffffff >> ((byte)((uint)*(undefined4 *)&pMVar3->field_0x8 >> 0x18) & 0x1f);
      local_54 = *(uint *)&pMVar3->field_0x8 & 0xffffff;
      while (local_54 = local_54 - 1, -1 < (int)local_54) {
        pMVar3->pData[(int)local_54] = 0xffffffff;
      }
    }
    pList._4_4_ = 0;
    while( true ) {
      bVar5 = false;
      if (_Value[pList._4_4_] != ' ') {
        local_40 = (int)_Value[pList._4_4_];
        bVar5 = local_40 != 0;
      }
      if (!bVar5) break;
      if (local_40 == 0x30) {
        iVar4 = pList._4_4_ * 2 + 1 >> 5;
        pMVar3->pData[iVar4] =
             (1 << ((char)pList._4_4_ * '\x02' + 1U & 0x1f) ^ 0xffffffffU) & pMVar3->pData[iVar4];
      }
      else if (local_40 == 0x31) {
        iVar4 = (pList._4_4_ << 1) >> 5;
        pMVar3->pData[iVar4] =
             (1 << ((byte)(pList._4_4_ << 1) & 0x1f) ^ 0xffffffffU) & pMVar3->pData[iVar4];
      }
      pList._4_4_ = pList._4_4_ + 1;
    }
  }
  return pCover;
}

Assistant:

Mvc_Cover_t * Dec_ConvertSopToMvc( char * pSop )
{
    Dec_Man_t * pManDec = (Dec_Man_t *)Abc_FrameReadManDec();
    Mvc_Manager_t * pMem = (Mvc_Manager_t *)pManDec->pMvcMem;
    Mvc_Cover_t * pMvc;
    Mvc_Cube_t * pMvcCube;
    char * pCube;
    int nVars, Value, v;

    // start the cover
    nVars = Abc_SopGetVarNum(pSop);
    assert( nVars > 0 );
    pMvc = Mvc_CoverAlloc( pMem, nVars * 2 );
    // check the logic function of the node
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        // create and add the cube
        pMvcCube = Mvc_CubeAlloc( pMvc );
        Mvc_CoverAddCubeTail( pMvc, pMvcCube );
        // fill in the literals
        Mvc_CubeBitFill( pMvcCube );
        Abc_CubeForEachVar( pCube, Value, v )
        {
            if ( Value == '0' )
                Mvc_CubeBitRemove( pMvcCube, v * 2 + 1 );
            else if ( Value == '1' )
                Mvc_CubeBitRemove( pMvcCube, v * 2 );
        }
    }
    return pMvc;
}